

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O3

sysbvm_tuple_t sysbvm_type_createWithName(sysbvm_context_t *context,sysbvm_tuple_t name)

{
  sysbvm_object_tuple_t *psVar1;
  
  psVar1 = sysbvm_context_allocatePointerTuple(context,(context->roots).typeType,0x1d);
  psVar1[2].header.field_0 =
       (anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0)(context->roots).anyValueType;
  psVar1[4].field_1.pointers[0] = 0xb;
  psVar1[3].field_1.pointers[0] = 0xb;
  psVar1[4].header.field_0.typePointer = 0xb;
  psVar1[4].header.identityHashAndFlags = 0xb;
  psVar1[4].header.objectSize = 0;
  if ((((ulong)psVar1 & 0xf) == 0 && psVar1 != (sysbvm_object_tuple_t *)0x0) &&
     (((psVar1->header).identityHashAndFlags & 0x80) == 0)) {
    (psVar1->field_1).pointers[0] = name;
  }
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createWithName(sysbvm_context_t *context, sysbvm_tuple_t name)
{
    sysbvm_tuple_t result = sysbvm_type_createAnonymous(context);
    sysbvm_type_setName(result, name);
    return result;
}